

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopCreateFromTruthIsop(Mem_Flex_t *pMan,int nVars,word *pTruth,Vec_Int_t *vCover)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  uVar3 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x1cd,"char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)")
    ;
  }
  uVar4 = 0;
  iVar1 = (int)uVar3;
  uVar5 = uVar4;
  if (0 < iVar1) {
    do {
      uVar5 = uVar4;
      if (pTruth[uVar4] != 0) break;
      uVar4 = uVar4 + 1;
      uVar5 = uVar3;
    } while (uVar3 != uVar4);
  }
  if ((int)uVar5 == iVar1) {
    pcVar6 = " 0\n";
  }
  else {
    uVar4 = 0;
    uVar5 = uVar4;
    if (0 < iVar1) {
      do {
        uVar5 = uVar4;
        if (pTruth[uVar4] != 0xffffffffffffffff) break;
        uVar4 = uVar4 + 1;
        uVar5 = uVar3;
      } while (uVar3 != uVar4);
    }
    if ((int)uVar5 != iVar1) {
      uVar2 = Kit_TruthIsop((uint *)pTruth,nVars,vCover,1);
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x1dd,
                      "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
      }
      if (1 < uVar2) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x1de,
                      "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
      }
      pcVar6 = Abc_SopCreateFromIsop(pMan,nVars,vCover);
      if (uVar2 != 0) {
        Abc_SopComplement(pcVar6);
      }
      return pcVar6;
    }
    pcVar6 = " 1\n";
  }
  pcVar6 = Abc_SopRegister(pMan,pcVar6);
  return pcVar6;
}

Assistant:

char * Abc_SopCreateFromTruthIsop( Mem_Flex_t * pMan, int nVars, word * pTruth, Vec_Int_t * vCover )
{
    char * pSop = NULL;
    int w, nWords  = Abc_Truth6WordNum( nVars );
    assert( nVars < 16 );

    for ( w = 0; w < nWords; w++ )
        if ( pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 0\n" );

    for ( w = 0; w < nWords; w++ )
        if ( ~pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 1\n" );

    {
        int RetValue = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        assert( nVars > 0 );
        assert( RetValue == 0 || RetValue == 1 );
        pSop = Abc_SopCreateFromIsop( pMan, nVars, vCover );
        if ( RetValue )
            Abc_SopComplement( pSop );
    }
    return pSop;
}